

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O1

int __thiscall QTextTableCell::tableCellFormatIndex(QTextTableCell *this)

{
  QTextDocument *pQVar1;
  
  pQVar1 = QTextObject::document((QTextObject *)this->table);
  return *(int *)(*(long *)(*(long *)&pQVar1->field_0x8 + 0x158) + 0x1c +
                 (ulong)(uint)this->fragment * 0x20);
}

Assistant:

int QTextTableCell::tableCellFormatIndex() const
{
    const QTextDocumentPrivate *p = QTextDocumentPrivate::get(table);
    return QTextDocumentPrivate::FragmentIterator(&p->fragmentMap(), fragment)->format;
}